

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void idx2::Resize<signed_char>(array<signed_char> *Array,i64 NewSize)

{
  long lVar1;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<signed_char>(Array,NewSize);
  }
  lVar1 = Array->Size;
  if (NewSize - lVar1 != 0 && lVar1 <= NewSize) {
    memset((Array->Buffer).Data + lVar1,0,NewSize - lVar1);
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}